

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PathTypeHandler.cpp
# Opt level: O2

BOOL __thiscall
Js::PathTypeHandlerBase::SetPropertyInternal<true>
          (PathTypeHandlerBase *this,DynamicObject *instance,PropertyId propertyId,
          PropertyIndex index,Var value,ObjectSlotAttributes attr,PropertyValueInfo *info,
          PropertyOperationFlags flags,SideEffects possibleSideEffects,bool isInit)

{
  Type *pTVar1;
  code *pcVar2;
  bool bVar3;
  int iVar4;
  BOOL BVar5;
  undefined4 *puVar6;
  undefined4 extraout_var;
  PathTypeHandlerBase *this_00;
  DynamicTypeHandler *pDVar7;
  undefined4 extraout_var_00;
  undefined7 in_register_00000089;
  ObjectSlotAttributes attr_00;
  ulong uVar8;
  uint32 local_44;
  Var pvStack_40;
  uint32 indexVal;
  uint local_34;
  
  uVar8 = CONCAT71(in_register_00000089,attr) & 0xffffffff;
  pvStack_40 = value;
  if (0xf < (uint)propertyId && value == (Var)0x0) {
    local_34 = (uint)CONCAT71(in_register_00000089,attr);
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar6 = 1;
    bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Types/PathTypeHandler.cpp"
                                ,0x31d,"(value != nullptr || IsInternalPropertyId(propertyId))",
                                "value != nullptr || IsInternalPropertyId(propertyId)");
    if (!bVar3) goto LAB_00c51a48;
    *puVar6 = 0;
    uVar8 = (ulong)local_34;
  }
  JavascriptLibrary::CheckAndInvalidateIsConcatSpreadableCache
            (propertyId,
             (((((instance->super_RecyclableObject).type.ptr)->javascriptLibrary).ptr)->
             super_JavascriptLibraryBase).scriptContext.ptr);
  pTVar1 = (instance->super_RecyclableObject).type.ptr;
  if (index == 0xffff) {
    BVar5 = ScriptContext::IsNumericPropertyId
                      ((((pTVar1->javascriptLibrary).ptr)->super_JavascriptLibraryBase).
                       scriptContext.ptr,propertyId,&local_44);
    attr_00 = (ObjectSlotAttributes)uVar8;
    if (BVar5 == 0) {
      BVar5 = AddPropertyInternal(this,instance,propertyId,pvStack_40,attr_00,info,flags,
                                  possibleSideEffects);
    }
    else if (attr_00 == ObjectSlotAttr_Default) {
      BVar5 = DynamicTypeHandler::SetItem
                        (&this->super_DynamicTypeHandler,instance,local_44,pvStack_40,
                         PropertyOperation_None);
    }
    else {
      iVar4 = (*(this->super_DynamicTypeHandler)._vptr_DynamicTypeHandler[0x48])(this,instance);
      BVar5 = (**(code **)(*(long *)CONCAT44(extraout_var_00,iVar4) + 0x170))
                        ((long *)CONCAT44(extraout_var_00,iVar4),instance,local_44,pvStack_40,
                         attr_00 & ObjectSlotAttr_PropertyAttributesMask);
    }
  }
  else {
    if ((*(char *)((long)&pTVar1[1].javascriptLibrary.ptr + 1) == '\x01') &&
       (((this->super_DynamicTypeHandler).flags & 0x10) == 0)) {
      local_34 = (uint)uVar8;
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar6 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
      *puVar6 = 1;
      bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Types/PathTypeHandler.cpp"
                                  ,0x327,
                                  "(!instance->GetDynamicType()->GetIsShared() || GetIsShared())",
                                  "!instance->GetDynamicType()->GetIsShared() || GetIsShared()");
      if (!bVar3) {
LAB_00c51a48:
        pcVar2 = (code *)invalidInstructionException();
        (*pcVar2)();
      }
      *puVar6 = 0;
      uVar8 = (ulong)local_34;
    }
    iVar4 = (*(this->super_DynamicTypeHandler)._vptr_DynamicTypeHandler[0x6b])(this);
    BVar5 = SetAttributesHelper(this,instance,propertyId,index,
                                (ObjectSlotAttributes *)CONCAT44(extraout_var,iVar4),
                                (ObjectSlotAttributes)uVar8,true);
    if (BVar5 == 0) {
      pDVar7 = DynamicObject::GetTypeHandler(instance);
      BVar5 = (*pDVar7->_vptr_DynamicTypeHandler[0x3a])
                        (pDVar7,instance,(ulong)(uint)propertyId,pvStack_40,uVar8 & 0xff,info,
                         (ulong)flags,(ulong)possibleSideEffects);
    }
    else {
      this_00 = FromTypeHandler(*(DynamicTypeHandler **)
                                 ((instance->super_RecyclableObject).type.ptr + 1));
      SetSlotAndCache(this_00,instance,propertyId,(PropertyRecord *)0x0,index,pvStack_40,info,flags,
                      possibleSideEffects);
      BVar5 = 1;
    }
  }
  return BVar5;
}

Assistant:

BOOL PathTypeHandlerBase::SetPropertyInternal(DynamicObject* instance, PropertyId propertyId, PropertyIndex index, Var value, ObjectSlotAttributes attr, PropertyValueInfo* info, PropertyOperationFlags flags, SideEffects possibleSideEffects, bool isInit)
    {
        PathTypeHandlerBase *newTypeHandler = nullptr;

        // Path type handler doesn't support pre-initialization (PropertyOperation_PreInit). Pre-initialized properties
        // will get marked as fixed when pre-initialized and then as non-fixed when their actual values are set.

        Assert(value != nullptr || IsInternalPropertyId(propertyId));

        JavascriptLibrary::CheckAndInvalidateIsConcatSpreadableCache(propertyId, instance->GetScriptContext());

        if (index != Constants::NoSlot)
        {
            // If type is shared then the handler must be shared as well.  This is a weaker invariant than in AddPropertyInternal,
            // because the type coming in here may be the result of DynamicObject::ChangeType(). In that case the handler may have
            // already been shared, but the newly created type isn't - and likely never will be - shared (is typically unreachable).
            // In CacheOperators::CachePropertyWrite we ensure that we never cache property adds for types that aren't shared.
            Assert(!instance->GetDynamicType()->GetIsShared() || GetIsShared());

            bool setAttrDone;
            if (setAttributes)
            {
                setAttrDone = this->SetAttributesHelper(instance, propertyId, index, GetAttributeArray(), attr, true);
                if (!setAttrDone)
                {
                    return instance->GetTypeHandler()->SetPropertyWithAttributes(instance, propertyId, value, attr, info, flags, possibleSideEffects);
                }
            }
            else if (isInit)
            {
                ObjectSlotAttributes * attributes = this->GetAttributeArray();
                if (attributes && (attributes[index] & ObjectSlotAttr_Accessor))
                {
                    setAttrDone = this->SetAttributesHelper(instance, propertyId, index, attributes, (ObjectSlotAttributes)(attributes[index] & ~ObjectSlotAttr_Accessor), true);
                    if (!setAttrDone)
                    {
                        return instance->GetTypeHandler()->InitProperty(instance, propertyId, value, flags, info);
                    }
                    // We're changing an accessor into a data property at object init time. Don't cache this transition from setter to non-setter,
                    // as it behaves differently from a normal set property.
                    PropertyValueInfo::SetNoCache(info, instance);
                    newTypeHandler = PathTypeHandlerBase::FromTypeHandler(instance->GetDynamicType()->GetTypeHandler());
                    newTypeHandler->SetSlotUnchecked(instance, index, value);
                    return true;
                }
            }
            newTypeHandler = PathTypeHandlerBase::FromTypeHandler(instance->GetDynamicType()->GetTypeHandler());
            newTypeHandler->SetSlotAndCache(instance, propertyId, nullptr, index, value, info, flags, possibleSideEffects);
            return true;
        }

        // Always check numeric propertyId. This may create an objectArray.
        ScriptContext* scriptContext = instance->GetScriptContext();
        uint32 indexVal;
        if (scriptContext->IsNumericPropertyId(propertyId, &indexVal))
        {
            if (setAttributes)
            {
                if (attr != ObjectSlotAttr_Default)
                {
                    return this->ConvertToTypeWithItemAttributes(instance)->SetItemWithAttributes(instance, indexVal, value, ObjectSlotAttributesToPropertyAttributes(attr));
                }
            }
            return PathTypeHandlerBase::SetItem(instance, indexVal, value, PropertyOperation_None);
        }

        return PathTypeHandlerBase::AddPropertyInternal(instance, propertyId, value, attr, info, flags, possibleSideEffects);
    }